

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::ReportPropertyOrigin
          (cmGeneratorTarget *this,string *p,string *result,string *report,string *compatibilityType
          )

{
  cmMakefile *this_00;
  Snapshot snapshot;
  char *pcVar1;
  mapped_type *pmVar2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  cmake *this_01;
  bool bVar4;
  allocator local_119;
  cmListFileBacktrace local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  string areport;
  cmCommandContext local_90;
  Snapshot local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = this->Target->Makefile;
  std::__cxx11::string::string
            ((string *)&local_118,"CMAKE_DEBUG_TARGET_PROPERTIES",(allocator *)&local_90);
  pcVar1 = cmMakefile::GetDefinition(this_00,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_118,pcVar1,(allocator *)&local_90);
    cmSystemTools::ExpandListArgument((string *)&local_118,&debugProperties,false);
    std::__cxx11::string::~string((string *)&local_118);
  }
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ::operator[](&this->DebugCompatiblePropertiesDone,p);
  if (*pmVar2 == false) {
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      (debugProperties.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       debugProperties.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,p);
    bVar4 = _Var3._M_current !=
            debugProperties.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    bVar4 = false;
  }
  if (this->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == true) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](&this->DebugCompatiblePropertiesDone,p);
    *pmVar2 = true;
  }
  if (bVar4) {
    std::__cxx11::string::string((string *)&areport,(string *)compatibilityType);
    std::__cxx11::string::string((string *)&local_50," of property \"",&local_119);
    std::operator+(&local_90.Name,&local_50,p);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118,
                   &local_90.Name,"\" for target \"");
    std::__cxx11::string::append((string *)&areport);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_118,(string *)&this->Target->Name);
    std::__cxx11::string::append((string *)&areport);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::append((char *)&areport);
    std::__cxx11::string::append((string *)&areport);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118,
                   "\"):\n",report);
    std::__cxx11::string::append((string *)&areport);
    std::__cxx11::string::~string((string *)&local_118);
    this_01 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
    cmState::Snapshot::Snapshot(&local_68,(cmState *)0x0);
    local_90.Name._M_dataplus._M_p = (pointer)&local_90.Name.field_2;
    local_90.Name._M_string_length = 0;
    local_90.Name.field_2._M_local_buf[0] = '\0';
    local_90.Line = 0;
    snapshot.Position.Tree = local_68.Position.Tree;
    snapshot.State = local_68.State;
    snapshot.Position.Position = local_68.Position.Position;
    cmListFileBacktrace::cmListFileBacktrace(&local_118,snapshot,&local_90);
    cmake::IssueMessage(this_01,LOG,&areport,&local_118,false);
    cmListFileBacktrace::~cmListFileBacktrace(&local_118);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&areport);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&debugProperties);
  return;
}

Assistant:

void
cmGeneratorTarget::ReportPropertyOrigin(const std::string &p,
                               const std::string &result,
                               const std::string &report,
                               const std::string &compatibilityType) const
{
  std::vector<std::string> debugProperties;
  const char *debugProp = this->Target->GetMakefile()
      ->GetDefinition("CMAKE_DEBUG_TARGET_PROPERTIES");
  if (debugProp)
    {
    cmSystemTools::ExpandListArgument(debugProp, debugProperties);
    }

  bool debugOrigin = !this->DebugCompatiblePropertiesDone[p]
                    && std::find(debugProperties.begin(),
                                 debugProperties.end(),
                                 p)
                        != debugProperties.end();

  if (this->GlobalGenerator->GetConfigureDoneCMP0026())
    {
    this->DebugCompatiblePropertiesDone[p] = true;
    }
  if (!debugOrigin)
    {
    return;
    }

  std::string areport = compatibilityType;
  areport += std::string(" of property \"") + p + "\" for target \"";
  areport += std::string(this->GetName());
  areport += "\" (result: \"";
  areport += result;
  areport += "\"):\n" + report;

  this->LocalGenerator->GetCMakeInstance()->IssueMessage(cmake::LOG, areport);
}